

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O0

void MWT::predict_or_learn<false,false,false>(mwt *c,single_learner *base,example *ec)

{
  byte *pbVar1;
  uchar *puVar2;
  cb_class *pcVar3;
  uchar **ppuVar4;
  unsigned_long **ppuVar5;
  policy_data *ppVar6;
  v_array<unsigned_char> *in_RDX;
  long in_RDI;
  float fVar7;
  uint64_t index;
  unsigned_long *__end2;
  unsigned_long *__begin2;
  v_array<unsigned_long> *__range2;
  v_array<float> preds;
  uint64_t policy;
  unsigned_long *__end3_1;
  unsigned_long *__begin3_1;
  v_array<unsigned_long> *__range3_1;
  uchar ns;
  uchar *__end3;
  uchar *__begin3;
  v_array<unsigned_char> *__range3;
  float *in_stack_ffffffffffffff48;
  v_array<float> *in_stack_ffffffffffffff50;
  label *in_stack_ffffffffffffff68;
  size_t *local_88;
  undefined8 in_stack_ffffffffffffff90;
  size_t sVar8;
  uint64_t in_stack_ffffffffffffff98;
  uchar *puVar9;
  mwt *in_stack_ffffffffffffffa0;
  uchar *puVar10;
  features *in_stack_ffffffffffffffa8;
  vw **in_stack_ffffffffffffffb0;
  size_t *psVar11;
  size_t *local_48;
  byte *local_28;
  
  pcVar3 = get_observed_cost(in_stack_ffffffffffffff68);
  *(cb_class **)(in_RDI + 0x120) = pcVar3;
  if (*(long *)(in_RDI + 0x120) != 0) {
    *(double *)(in_RDI + 0x148) = *(double *)(in_RDI + 0x148) + 1.0;
    ppuVar4 = v_array<unsigned_char>::begin(in_RDX);
    local_28 = *ppuVar4;
    ppuVar4 = v_array<unsigned_char>::end(in_RDX);
    pbVar1 = *ppuVar4;
    for (; local_28 != pbVar1; local_28 = local_28 + 1) {
      if ((*(byte *)(in_RDI + (ulong)*local_28) & 1) != 0) {
        GD::foreach_feature<MWT::mwt,_&MWT::value_policy,_vw_*>
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98,(float)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      }
    }
    ppuVar5 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(in_RDI + 0x128));
    local_48 = *ppuVar5;
    ppuVar5 = v_array<unsigned_long>::end((v_array<unsigned_long> *)(in_RDI + 0x128));
    psVar11 = *ppuVar5;
    for (; local_48 != psVar11; local_48 = local_48 + 1) {
      sVar8 = *local_48;
      in_stack_ffffffffffffff50 = *(v_array<float> **)(in_RDI + 0x120);
      ppVar6 = v_array<MWT::policy_data>::operator[]
                         ((v_array<MWT::policy_data> *)(in_RDI + 0x100),sVar8);
      fVar7 = CB_ALGS::get_unbiased_cost((cb_class *)in_stack_ffffffffffffff50,ppVar6->action,0.0);
      ppVar6 = v_array<MWT::policy_data>::operator[]
                         ((v_array<MWT::policy_data> *)(in_RDI + 0x100),sVar8);
      ppVar6->cost = (double)fVar7 + ppVar6->cost;
      ppVar6 = v_array<MWT::policy_data>::operator[]
                         ((v_array<MWT::policy_data> *)(in_RDI + 0x100),sVar8);
      ppVar6->action = 0;
    }
  }
  puVar2 = in_RDX[0x342].end_array;
  sVar8 = in_RDX[0x342].erase_count;
  puVar9 = in_RDX[0x343]._begin;
  puVar10 = in_RDX[0x343]._end;
  v_array<float>::clear(in_stack_ffffffffffffff50);
  ppuVar5 = v_array<unsigned_long>::begin((v_array<unsigned_long> *)(in_RDI + 0x128));
  local_88 = *ppuVar5;
  ppuVar5 = v_array<unsigned_long>::end((v_array<unsigned_long> *)(in_RDI + 0x128));
  psVar11 = *ppuVar5;
  for (; local_88 != psVar11; local_88 = local_88 + 1) {
    v_array<MWT::policy_data>::operator[]((v_array<MWT::policy_data> *)(in_RDI + 0x100),*local_88);
    v_array<float>::push_back(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  in_RDX[0x342].end_array = puVar2;
  in_RDX[0x342].erase_count = sVar8;
  in_RDX[0x343]._begin = puVar9;
  in_RDX[0x343]._end = puVar10;
  return;
}

Assistant:

void predict_or_learn(mwt& c, single_learner& base, example& ec)
{
  c.observation = get_observed_cost(ec.l.cb);

  if (c.observation != nullptr)
  {
    c.total++;
    // For each nonzero feature in observed namespaces, check it's value.
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
        GD::foreach_feature<mwt, value_policy>(c.all, ec.feature_space[ns], c);
    for (uint64_t policy : c.policies)
    {
      c.evals[policy].cost += get_unbiased_cost(c.observation, c.evals[policy].action);
      c.evals[policy].action = 0;
    }
  }
  if (exclude || learn)
  {
    c.indices.clear();
    uint32_t stride_shift = c.all->weights.stride_shift();
    uint64_t weight_mask = c.all->weights.mask();
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
      {
        c.indices.push_back(ns);
        if (learn)
        {
          c.feature_space[ns].clear();
          for (features::iterator& f : ec.feature_space[ns])
          {
            uint64_t new_index = ((f.index() & weight_mask) >> stride_shift) * c.num_classes + (uint64_t)f.value();
            c.feature_space[ns].push_back(1, new_index << stride_shift);
          }
        }
        std::swap(c.feature_space[ns], ec.feature_space[ns]);
      }
  }

  // modify the predictions to use a vector with a score for each evaluated feature.
  v_array<float> preds = ec.pred.scalars;

  if (learn)
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
  }

  if (exclude || learn)
    while (c.indices.size() > 0)
    {
      unsigned char ns = c.indices.pop();
      swap(c.feature_space[ns], ec.feature_space[ns]);
    }

  // modify the predictions to use a vector with a score for each evaluated feature.
  preds.clear();
  if (learn)
    preds.push_back((float)ec.pred.multiclass);
  for (uint64_t index : c.policies) preds.push_back((float)c.evals[index].cost / (float)c.total);

  ec.pred.scalars = preds;
}